

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O2

Slice __thiscall leveldb::anon_unknown_6::TwoLevelIterator::key(TwoLevelIterator *this)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  Slice SVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = (*(this->super_Iterator)._vptr_Iterator[2])();
  if ((char)iVar2 == '\0') {
    __assert_fail("Valid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/table/two_level_iterator.cc"
                  ,0x21,
                  "virtual Slice leveldb::(anonymous namespace)::TwoLevelIterator::key() const");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    SVar3 = IteratorWrapper::key(&this->data_iter_);
    return SVar3;
  }
  __stack_chk_fail();
}

Assistant:

Slice key() const override {
    assert(Valid());
    return data_iter_.key();
  }